

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

_Bool modify_monster_trap(loc grid)

{
  _Bool _Var1;
  _Bool _Var2;
  char *fmt;
  
  fmt = "You can not see to modify your trap.";
  if ((player->timed[2] == 0) && (_Var1 = no_light(player), !_Var1)) {
    fmt = "You are too confused.";
    if ((player->timed[4] == 0) && (player->timed[6] == 0)) {
      _Var1 = player_is_shapechanged(player);
      if (_Var1) {
        msg("You cannot do this while in %s form.",player->shape->name);
        _Var1 = get_check("Do you want to change back? ");
        if (!_Var1) {
          return false;
        }
        player_resume_normal_shape(player);
      }
      _Var1 = true;
      mtrap_grid = grid;
      _Var2 = mtrap_menu();
      if (!_Var2) {
        return true;
      }
      fmt = "You modify the monster trap.";
      goto LAB_001d42e5;
    }
  }
  _Var1 = false;
LAB_001d42e5:
  msg(fmt);
  return _Var1;
}

Assistant:

bool modify_monster_trap(struct loc grid)
{
	if (player->timed[TMD_BLIND] || no_light(player)) {
		msg("You can not see to modify your trap.");
		return false;
	}

	if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE]) {
		msg("You are too confused.");
		return false;
	}

	/* No setting traps while shapeshifted */
	if (player_is_shapechanged(player)) {
		msg("You cannot do this while in %s form.",	player->shape->name);
		if (get_check("Do you want to change back? " )) {
			player_resume_normal_shape(player);
		} else {
			return false;
		}
	}

	mtrap_grid = grid;

	/* Get choice */
	if (mtrap_menu()) {
		/* Notify the player. */
		msg("You modify the monster trap.");
	}

	/* Trap was modified */
	return true;
}